

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

string * __thiscall
yactfr::internal::DsPktProc::toStr_abi_cxx11_
          (string *__return_storage_ptr__,DsPktProc *this,Size indent)

{
  bool bVar1;
  ostream *poVar2;
  TypeId TVar3;
  Size SVar4;
  pointer pEVar5;
  Size indent_00;
  Size indent_01;
  Size indent_02;
  Size indent_03;
  string local_3c0;
  reference local_3a0;
  value_type *idErProcUpPair;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  ErProcsMap *__range3_1;
  unique_ptr *local_360;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> *erProcUp;
  const_iterator __end3;
  const_iterator __begin3;
  ErProcsVec *__range3;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  allocator local_251;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss;
  Size indent_local;
  DsPktProc *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  indent_abi_cxx11_(&local_1b8,(internal *)indent,indent_00);
  poVar2 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"DS packet proc",&local_209);
  anon_unknown_8::_strTopName(&local_1e8,&local_208);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"dst-id",&local_251);
  _strProp(&local_230,&local_250);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  TVar3 = DataStreamType::id(this->_dst);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,TVar3);
  poVar2 = std::operator<<(poVar2," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"er-align",&local_299);
  _strProp(&local_278,&local_298);
  poVar2 = std::operator<<(poVar2,(string *)&local_278);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_erAlign);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1b8);
  indent_abi_cxx11_(&local_2c0,(internal *)(indent + 1),indent_01);
  poVar2 = std::operator<<((ostream *)local_198,(string *)&local_2c0);
  poVar2 = std::operator<<(poVar2,"<pkt preamble proc>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2c0);
  Proc::toStr_abi_cxx11_(&local_2e0,&this->_pktPreambleProc,indent + 2);
  std::operator<<((ostream *)local_198,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  indent_abi_cxx11_(&local_300,(internal *)(indent + 1),indent_02);
  poVar2 = std::operator<<((ostream *)local_198,(string *)&local_300);
  poVar2 = std::operator<<(poVar2,"<ER preamble proc>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_300);
  Proc::toStr_abi_cxx11_(&local_320,&this->_erPreambleProc,indent + 2);
  std::operator<<((ostream *)local_198,(string *)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  SVar4 = erProcsCount(this);
  if (SVar4 != 0) {
    indent_abi_cxx11_((string *)&__range3,(internal *)(indent + 1),indent_03);
    poVar2 = std::operator<<((ostream *)local_198,(string *)&__range3);
    poVar2 = std::operator<<(poVar2,"<ER procs>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&__range3);
    __end3 = std::
             vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ::begin(&this->_erProcsVec);
    erProcUp = (unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                *)std::
                  vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
                  ::end(&this->_erProcsVec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_*,_std::vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
                                       *)&erProcUp), bVar1) {
      local_360 = (unique_ptr *)
                  __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_*,_std::vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
                  ::operator*(&__end3);
      bVar1 = std::unique_ptr::operator_cast_to_bool(local_360);
      if (bVar1) {
        pEVar5 = std::
                 unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                 ::operator->((unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                               *)local_360);
        ErProc::toStr_abi_cxx11_((string *)&__range3_1,pEVar5,indent + 2);
        std::operator<<((ostream *)local_198,(string *)&__range3_1);
        std::__cxx11::string::~string((string *)&__range3_1);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_*,_std::vector<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
               ::begin(&this->_erProcsMap);
    idErProcUpPair =
         (value_type *)
         std::
         unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>_>
         ::end(&this->_erProcsMap);
    while (bVar1 = std::__detail::operator!=
                             (&__end3_1.
                               super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false>
                                *)&idErProcUpPair), bVar1) {
      local_3a0 = std::__detail::
                  _Node_const_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false,_false>
                  ::operator*(&__end3_1);
      pEVar5 = std::
               unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
               ::operator->(&local_3a0->second);
      ErProc::toStr_abi_cxx11_(&local_3c0,pEVar5,indent + 2);
      std::operator<<((ostream *)local_198,(string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_false,_false>
      ::operator++(&__end3_1);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string DsPktProc::toStr(const Size indent) const
{
    std::ostringstream ss;

    ss << internal::indent(indent) << _strTopName("DS packet proc") <<
          " " << _strProp("dst-id") << _dst->id() <<
          " " << _strProp("er-align") << _erAlign << std::endl;
    ss << internal::indent(indent + 1) << "<pkt preamble proc>" << std::endl;
    ss << _pktPreambleProc.toStr(indent + 2);
    ss << internal::indent(indent + 1) << "<ER preamble proc>" << std::endl;
    ss << _erPreambleProc.toStr(indent + 2);

    if (this->erProcsCount() > 0) {
        ss << internal::indent(indent + 1) << "<ER procs>" << std::endl;

        for (const auto& erProcUp : _erProcsVec) {
            if (erProcUp) {
                ss << erProcUp->toStr(indent + 2);
            }
        }

        for (const auto& idErProcUpPair : _erProcsMap) {
            ss << idErProcUpPair.second->toStr(indent + 2);
        }
    }

    return ss.str();
}